

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings.cpp
# Opt level: O3

void __thiscall E64::settings_t::settings_t(settings_t *this)

{
  char *__s;
  char *pcVar1;
  DIR *pDVar2;
  int iVar3;
  char *pcVar4;
  
  __s = this->settings_path;
  pcVar1 = getenv("HOME");
  iVar3 = 0;
  snprintf(__s,0x100,"%s",pcVar1);
  pcVar1 = this->home_dir + 0xff;
  do {
    pcVar4 = pcVar1;
    if ((pcVar4[1] == '/') || (pcVar4[1] == '\0')) {
      iVar3 = iVar3 + 1;
    }
    pcVar1 = pcVar4 + 1;
  } while (iVar3 < 3);
  pcVar4[1] = '\0';
  pcVar1 = this->home_dir;
  strcpy(pcVar1,__s);
  strcpy(this->current_path,pcVar1);
  printf("[Settings] user home directory: %s\n",pcVar1);
  builtin_strncpy(pcVar4 + 1,"/.E64-II",9);
  printf("[Settings] opening settings directory: %s\n",__s);
  pDVar2 = opendir(__s);
  this->settings_directory = (DIR *)pDVar2;
  if (pDVar2 == (DIR *)0x0) {
    puts("[Settings] error: directory doesn\'t exist. Trying to make it...");
    mkdir(__s,0x1ff);
    pDVar2 = opendir(__s);
    this->settings_directory = (DIR *)pDVar2;
  }
  snprintf(this->path_to_kernel,0x100,"%s/kernel.bin",__s);
  chdir(__s);
  update_current_path_from_settings(this);
  return;
}

Assistant:

E64::settings_t::settings_t()
{
	snprintf(settings_path, 256, "%s", getenv("HOME"));     // within apple app container this returns a long path

	// shorten the path name to home and user dir
	char *iterator = settings_path;
	int times = 0;
	while (times < 3) {
		if((*iterator == '/') || (*iterator == '\0')) times++;
		iterator++;
	}
	iterator--;
	*iterator = '\0';   // force '\0' character to terminate string to copy to 'home_dir'
    
	strcpy(home_dir, settings_path);
	strcpy(current_path, home_dir);    // current path defaults to homedir
	printf("[Settings] user home directory: %s\n", home_dir);

	snprintf(iterator, 256, "/.E64-II");
    
	printf("[Settings] opening settings directory: %s\n", settings_path);
	settings_directory = opendir(settings_path);
	if (settings_directory == NULL) {
		printf("[Settings] error: directory doesn't exist. Trying to make it...\n");
		mkdir(settings_path, 0777);
		settings_directory = opendir(settings_path);
	}

	snprintf(path_to_kernel, 256, "%s/kernel.bin", settings_path);

	// switch to settings path and try to update current_path from settings
	chdir(settings_path);
	update_current_path_from_settings();
}